

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

int cond(LexState *ls)

{
  undefined1 local_48 [8];
  expdesc v;
  LexState *ls_local;
  
  v._48_8_ = ls;
  memset(local_48,0,0x38);
  v.t = -1;
  v.usertype._0_4_ = 0xffffffff;
  expr((LexState *)v._48_8_,(expdesc *)local_48);
  if (local_48._0_4_ == VNIL) {
    local_48._0_4_ = VFALSE;
  }
  luaK_goiftrue(*(FuncState **)(v._48_8_ + 0x30),(expdesc *)local_48);
  return v.u._12_4_;
}

Assistant:

static int cond (LexState *ls) {
  /* cond -> exp */
  expdesc v = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  expr(ls, &v);                   /* read condition */
  if (v.k == VNIL) v.k = VFALSE;  /* 'falses' are all equal here */
  luaK_goiftrue(ls->fs, &v);
  return v.f;
}